

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O2

Scale * icu_63::number::Scale::byDouble(Scale *__return_storage_ptr__,double multiplicand)

{
  LocalPointer<icu_63::number::impl::DecNum> arbitraryToAdopt;
  size_t in_RSI;
  UErrorCode localError;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  
  localError = U_ZERO_ERROR;
  decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
       (LocalPointerBase<icu_63::number::impl::DecNum>)UMemory::operator_new((UMemory *)0x60,in_RSI)
  ;
  if (decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr == (DecNum *)0x0) {
    localError = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    impl::DecNum::DecNum((DecNum *)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
    impl::DecNum::setTo((DecNum *)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr,
                        multiplicand,&localError);
    arbitraryToAdopt.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
         decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr;
    if (localError < U_ILLEGAL_ARGUMENT_ERROR) {
      decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
           (LocalPointerBase<icu_63::number::impl::DecNum>)(DecNum *)0x0;
      Scale(__return_storage_ptr__,0,
            (DecNum *)arbitraryToAdopt.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
      goto LAB_00254bc5;
    }
  }
  __return_storage_ptr__->fMagnitude = 0;
  __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
  __return_storage_ptr__->fError = localError;
LAB_00254bc5:
  LocalPointer<icu_63::number::impl::DecNum>::~LocalPointer(&decnum);
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDouble(double multiplicand) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {0, decnum.orphan()};
}